

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::(anonymous_namespace)::SymbolByParentEq::operator()
          (void *this,Symbol *a,Symbol *b)

{
  bool bVar1;
  pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> pStack_48;
  pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> local_30;
  
  Symbol::parent_name_key(&local_30,(Symbol *)this);
  Symbol::parent_name_key(&pStack_48,a);
  bVar1 = std::operator==(&local_30,&pStack_48);
  return bVar1;
}

Assistant:

bool operator()(const T& a, const U& b) const {
    return a.parent_name_key() == b.parent_name_key();
  }